

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::InvocationReadWriteCase::
genShaderMainBlock_abi_cxx11_(string *__return_storage_ptr__,void *this)

{
  ostream *poVar1;
  int local_29c;
  undefined1 local_298 [4];
  int ndx_1;
  byte local_278;
  allocator<char> local_277;
  byte local_276;
  byte local_275;
  int local_274;
  string local_270;
  byte local_24f;
  byte local_24e;
  byte local_24d;
  int local_23c;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  string localID;
  undefined1 local_190 [4];
  int ndx;
  ostringstream buf;
  InvocationReadWriteCase *this_local;
  
  buf._368_8_ = this;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  for (localID.field_2._12_4_ = 0; (int)localID.field_2._12_4_ < *(int *)((long)this + 0x90);
      localID.field_2._12_4_ = localID.field_2._12_4_ + 1) {
    local_24d = 0;
    local_24e = 0;
    local_24f = 0;
    local_275 = 0;
    local_276 = 0;
    local_278 = 0;
    if ((*(byte *)((long)this + 0x7e) & 1) == 0) {
      std::allocator<char>::allocator();
      local_278 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b8,"gl_LocalInvocationID.xy",&local_277);
    }
    else {
      local_23c = localID.field_2._12_4_ + 1;
      de::toString<int>(&local_238,&local_23c);
      local_24d = 1;
      std::operator+(&local_218,"(gl_LocalInvocationID.xy + uvec2(",&local_238);
      local_24e = 1;
      std::operator+(&local_1f8,&local_218,", ");
      local_24f = 1;
      local_274 = localID.field_2._12_4_ * 2;
      de::toString<int>(&local_270,&local_274);
      local_275 = 1;
      std::operator+(&local_1d8,&local_1f8,&local_270);
      local_276 = 1;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
                     &local_1d8,")) % gl_WorkGroupSize.xy");
    }
    if ((local_278 & 1) != 0) {
      std::allocator<char>::~allocator(&local_277);
    }
    if ((local_276 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    if ((local_275 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_270);
    }
    if ((local_24f & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1f8);
    }
    if ((local_24e & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_218);
    }
    if ((local_24d & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_238);
    }
    if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(");
      poVar1 = std::operator<<(poVar1,(string *)local_1b8);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID.field_2._12_4_);
      std::operator<<(poVar1,")], 123) == 0);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,"\tallOk = allOk && (sb_store.values[getIndex(")
      ;
      poVar1 = std::operator<<(poVar1,(string *)local_1b8);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID.field_2._12_4_);
      std::operator<<(poVar1,")] == 0);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(");
      poVar1 = std::operator<<(poVar1,(string *)local_1b8);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID.field_2._12_4_);
      std::operator<<(poVar1,"), 123) == 0);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tallOk = allOk && (imageLoad(u_image, getCoord(");
      poVar1 = std::operator<<(poVar1,(string *)local_1b8);
      poVar1 = std::operator<<(poVar1,", ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,localID.field_2._12_4_);
      std::operator<<(poVar1,")).x == 0);\n");
    }
    std::__cxx11::string::~string((string *)local_1b8);
  }
  InterInvocationTestCase::genBarrierSource_abi_cxx11_((string *)local_298,this);
  std::operator<<((ostream *)local_190,(string *)local_298);
  std::__cxx11::string::~string((string *)local_298);
  for (local_29c = 0; local_29c < *(int *)((long)this + 0x90); local_29c = local_29c + 1) {
    if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_29c);
      std::operator<<(poVar1,")], groupNdx);\n");
    }
    else if ((*(int *)((long)this + 0x78) == 0) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_29c);
      std::operator<<(poVar1,")] = groupNdx;\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) != 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_29c);
      std::operator<<(poVar1,"), int(groupNdx));\n");
    }
    else if ((*(int *)((long)this + 0x78) == 1) && ((*(byte *)((long)this + 0x7c) & 1) == 0)) {
      poVar1 = std::operator<<((ostream *)local_190,
                               "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_29c);
      std::operator<<(poVar1,"), ivec4(int(groupNdx), 0, 0, 0));\n");
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string InvocationReadWriteCase::genShaderMainBlock (void) const
{
	std::ostringstream buf;

	// read

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		const std::string localID = (m_syncWithGroup) ? ("(gl_LocalInvocationID.xy + uvec2(" + de::toString(ndx+1) + ", " + de::toString(2*ndx) + ")) % gl_WorkGroupSize.xy") : ("gl_LocalInvocationID.xy");

		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tallOk = allOk && (atomicExchange(sb_store.values[getIndex(" << localID << ", " << ndx << ")], 123) == 0);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tallOk = allOk && (sb_store.values[getIndex(" << localID << ", " << ndx << ")] == 0);\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\tallOk = allOk && (imageAtomicExchange(u_image, getCoord(" << localID << ", " << ndx << "), 123) == 0);\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\tallOk = allOk && (imageLoad(u_image, getCoord(" << localID << ", " << ndx << ")).x == 0);\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	// barrier

	buf << genBarrierSource();

	// write

	for (int ndx = 0; ndx < m_elementsPerInvocation; ++ndx)
	{
		if (m_storage == STORAGE_BUFFER && m_useAtomic)
			buf << "\tatomicAdd(sb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")], groupNdx);\n";
		else if (m_storage == STORAGE_BUFFER && !m_useAtomic)
			buf << "\tsb_store.values[getIndex(gl_LocalInvocationID.xy, " << ndx << ")] = groupNdx;\n";
		else if (m_storage == STORAGE_IMAGE && m_useAtomic)
			buf << "\timageAtomicAdd(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), int(groupNdx));\n";
		else if (m_storage == STORAGE_IMAGE && !m_useAtomic)
			buf << "\timageStore(u_image, getCoord(gl_LocalInvocationID.xy, " << ndx << "), ivec4(int(groupNdx), 0, 0, 0));\n";
		else
			DE_ASSERT(DE_FALSE);
	}

	return buf.str();
}